

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p_p.h
# Opt level: O3

void __thiscall QObjectPrivate::ConnectionData::resizeSignalVector(ConnectionData *this,size_t size)

{
  __pointer_type __src;
  size_t sVar1;
  __pointer_type __dest;
  long lVar2;
  Connection *pCVar3;
  Connection *pCVar4;
  __pointer_type pSVar5;
  quintptr qVar6;
  int iVar7;
  quintptr qVar8;
  size_t allocSize;
  bool bVar9;
  
  __src = (this->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b
          ._M_p;
  if ((__src != (__pointer_type)0x0) && (size < __src->allocated)) {
    return;
  }
  qVar6 = size + 7 & 0xfffffffffffffff8;
  if (size + 7 >> 0x3c == 0) {
    allocSize = qVar6 << 4 | 0x20;
    sVar1 = QtPrivate::expectedAllocSize(allocSize,0x10);
    if (sVar1 != 0) {
      qVar6 = (sVar1 - 0x10 >> 4) - 1;
      allocSize = (sVar1 - 0x10 & 0xfffffffffffffff0) + 0x10;
      if (allocSize == 0) goto LAB_002bacd0;
    }
    __dest = (__pointer_type)malloc(allocSize);
  }
  else {
LAB_002bacd0:
    __dest = (__pointer_type)0x0;
  }
  if (__src == (__pointer_type)0x0) {
    qVar8 = 0xffffffff;
  }
  else {
    qVar8 = __src->allocated;
    memcpy(__dest,__src,qVar8 * 0x10 + 0x20);
  }
  iVar7 = (int)qVar8;
  if (iVar7 < (int)qVar6) {
    lVar2 = (long)(int)qVar6 - (long)iVar7;
    pSVar5 = __dest + (long)iVar7 + 2;
    do {
      (pSVar5->super_ConnectionOrSignalVector).field_0.next = (Connection *)0x0;
      pSVar5->allocated = 0;
      pSVar5 = pSVar5 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (__dest->super_ConnectionOrSignalVector).field_0.next = (Connection *)0x0;
  __dest->allocated = qVar6;
  (this->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p =
       __dest;
  if (__src != (__pointer_type)0x0) {
    pCVar3 = (Connection *)(this->orphaned)._M_i.c;
    do {
      (__src->super_ConnectionOrSignalVector).field_0.next = pCVar3;
      LOCK();
      pCVar4 = (Connection *)(this->orphaned)._M_i.c;
      bVar9 = pCVar3 == pCVar4;
      if (bVar9) {
        (this->orphaned)._M_i.c = (ulong)__src | 1;
        pCVar4 = pCVar3;
      }
      UNLOCK();
      pCVar3 = pCVar4;
    } while (!bVar9);
  }
  return;
}

Assistant:

void resizeSignalVector(size_t size)
    {
        SignalVector *vector = this->signalVector.loadRelaxed();
        if (vector && vector->allocated > size)
            return;
        size = (size + 7) & ~7;
        void *ptr = QtPrivate::fittedMalloc(sizeof(SignalVector), &size, sizeof(ConnectionList), 1);
        auto newVector = new (ptr) SignalVector;

        int start = -1;
        if (vector) {
            // not (yet) existing trait:
            // static_assert(std::is_relocatable_v<SignalVector>);
            // static_assert(std::is_relocatable_v<ConnectionList>);
            memcpy(newVector, vector,
                   sizeof(SignalVector) + (vector->allocated + 1) * sizeof(ConnectionList));
            start = vector->count();
        }
        for (int i = start; i < int(size); ++i)
            new (&newVector->at(i)) ConnectionList();
        newVector->next = nullptr;
        newVector->allocated = size;

        signalVector.storeRelaxed(newVector);
        if (vector) {
            TaggedSignalVector o = nullptr;
            /* No ABA issue here: When adding a node, we only care about the list head, it doesn't
             * matter if the tail changes.
             */
            o = orphaned.load(std::memory_order_acquire);
            do {
                vector->nextInOrphanList = o;
            } while (!orphaned.compare_exchange_strong(o, TaggedSignalVector(vector), std::memory_order_release));
        }
    }